

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frame_size_tests.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_11f98de::AV1FrameSizeTests_OneByOneVideo_Test::TestBody
          (AV1FrameSizeTests_OneByOneVideo_Test *this)

{
  bool bVar1;
  AssertHelper AStack_68;
  HasNewFatalFailureHelper gtest_fatal_failure_checker;
  RandomVideoSource video;
  
  libaom_test::RandomVideoSource::RandomVideoSource(&video,0xbaba);
  libaom_test::DummyVideoSource::SetSize(&video.super_DummyVideoSource,1,1);
  video.super_DummyVideoSource.limit_ = 2;
  *(undefined4 *)&(this->super_AV1FrameSizeTests).super_EncoderTest.field_0x3dc = 0;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::HasNewFatalFailureHelper::HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      (*(this->super_AV1FrameSizeTests).super_EncoderTest._vptr_EncoderTest[2])
                (&(this->super_AV1FrameSizeTests).super_EncoderTest,&video);
    }
    testing::internal::HasNewFatalFailureHelper::~HasNewFatalFailureHelper
              (&gtest_fatal_failure_checker);
    if (gtest_fatal_failure_checker.has_new_fatal_failure_ == false) goto LAB_005d375f;
  }
  testing::Message::Message((Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::AssertHelper
            (&AStack_68,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/frame_size_tests.cc"
             ,0x50,
             "Expected: RunLoop(&video) doesn\'t generate new fatal failures in the current thread.\n  Actual: it does."
            );
  testing::internal::AssertHelper::operator=(&AStack_68,(Message *)&gtest_fatal_failure_checker);
  testing::internal::AssertHelper::~AssertHelper(&AStack_68);
  if (gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
      _vptr_TestPartResultReporterInterface != (_func_int **)0x0) {
    (**(code **)(*gtest_fatal_failure_checker.super_TestPartResultReporterInterface.
                  _vptr_TestPartResultReporterInterface + 8))();
  }
LAB_005d375f:
  libaom_test::DummyVideoSource::~DummyVideoSource(&video.super_DummyVideoSource);
  return;
}

Assistant:

TEST_F(AV1FrameSizeTests, OneByOneVideo) {
  ::libaom_test::RandomVideoSource video;

  video.SetSize(1, 1);
  video.set_limit(2);
  expected_res_ = AOM_CODEC_OK;
  ASSERT_NO_FATAL_FAILURE(RunLoop(&video));
}